

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

natwm_error string_find_last_nonspace(char *string,size_t *index_result)

{
  char cVar1;
  bool bVar2;
  ushort **ppuVar3;
  size_t sStack_38;
  _Bool found;
  size_t index;
  size_t i;
  char ch;
  size_t *index_result_local;
  char *string_local;
  
  if (string == (char *)0x0) {
    string_local._4_4_ = INVALID_INPUT_ERROR;
  }
  else {
    sStack_38 = 0;
    bVar2 = false;
    for (index = 0; cVar1 = string[index], cVar1 != '\0'; index = index + 1) {
      ppuVar3 = __ctype_b_loc();
      if ((((*ppuVar3)[(int)cVar1] & 0x2000) == 0) && (sStack_38 = index, !bVar2)) {
        bVar2 = true;
      }
    }
    *index_result = sStack_38;
    if (bVar2) {
      string_local._4_4_ = NO_ERROR;
    }
    else {
      string_local._4_4_ = NOT_FOUND_ERROR;
    }
  }
  return string_local._4_4_;
}

Assistant:

enum natwm_error string_find_last_nonspace(const char *string, size_t *index_result)
{
        if (string == NULL) {
                return INVALID_INPUT_ERROR;
        }

        char ch = '\0';
        size_t i = 0;
        size_t index = 0;
        bool found = false;

        while ((ch = string[i]) != '\0') {
                if (!isspace(ch)) {
                        index = i;

                        if (!found) {
                                found = true;
                        }
                }

                ++i;
        }

        *index_result = index;

        if (!found) {
                return NOT_FOUND_ERROR;
        }

        return NO_ERROR;
}